

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
         declareAndInitializeShaderVariable
                   (string *__return_storage_ptr__,DataType dataType,string *varName)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream variable;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  pcVar1 = glu::getDataTypeName(dataType);
  poVar2 = std::operator<<(&local_190,pcVar1);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)varName);
  poVar2 = std::operator<<(poVar2," = ");
  pcVar1 = glu::getDataTypeName(dataType);
  std::operator<<(poVar2,pcVar1);
  switch(dataType) {
  case TYPE_INT:
    pcVar1 = "(1);\n";
    break;
  case TYPE_INT_VEC2:
    pcVar1 = "(1, 1);\n";
    break;
  case TYPE_INT_VEC3:
    pcVar1 = "(1, 1, 1);\n";
    break;
  case TYPE_INT_VEC4:
    pcVar1 = "(1, 1, 1, 1);\n";
    break;
  case TYPE_UINT:
    pcVar1 = "(1u);\n";
    break;
  case TYPE_UINT_VEC2:
    pcVar1 = "(1u, 1u);\n";
    break;
  case TYPE_UINT_VEC3:
    pcVar1 = "(1u, 1u, 1u);\n";
    break;
  case TYPE_UINT_VEC4:
    pcVar1 = "(1u, 1u, 1u, 1u);\n";
    break;
  default:
    switch(dataType) {
    case TYPE_FLOAT:
      pcVar1 = "(1.0);\n";
      break;
    case TYPE_FLOAT_VEC2:
      pcVar1 = "(1.0, 1.0);\n";
      break;
    case TYPE_FLOAT_VEC3:
      pcVar1 = "(1.0, 1.0, 1.0);\n";
      break;
    case TYPE_FLOAT_VEC4:
      pcVar1 = "(1.0, 1.0, 1.0, 1.0);\n";
      break;
    default:
      goto switchD_0136c1b1_default;
    }
  }
  std::operator<<(&local_190,pcVar1);
switchD_0136c1b1_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string declareAndInitializeShaderVariable (glu::DataType dataType, std::string varName)
{
	std::ostringstream variable;
	variable << getDataTypeName(dataType) << " " << varName << " = " << getDataTypeName(dataType);
	switch (dataType)
	{
		case glu::TYPE_FLOAT:		variable << "(1.0);\n";					break;
		case glu::TYPE_FLOAT_VEC2:	variable << "(1.0, 1.0);\n";			break;
		case glu::TYPE_FLOAT_VEC3:	variable << "(1.0, 1.0, 1.0);\n";		break;
		case glu::TYPE_FLOAT_VEC4:	variable << "(1.0, 1.0, 1.0, 1.0);\n";	break;
		case glu::TYPE_INT:			variable << "(1);\n";					break;
		case glu::TYPE_INT_VEC2:	variable << "(1, 1);\n";				break;
		case glu::TYPE_INT_VEC3:	variable << "(1, 1, 1);\n";				break;
		case glu::TYPE_INT_VEC4:	variable << "(1, 1, 1, 1);\n";			break;
		case glu::TYPE_UINT:		variable << "(1u);\n";					break;
		case glu::TYPE_UINT_VEC2:	variable << "(1u, 1u);\n";				break;
		case glu::TYPE_UINT_VEC3:	variable << "(1u, 1u, 1u);\n";			break;
		case glu::TYPE_UINT_VEC4:	variable << "(1u, 1u, 1u, 1u);\n";		break;
		default:
			DE_FATAL("Unsupported data type.");
	}
	return variable.str();
}